

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckStore
          (ScalarReplacementPass *this,Instruction *inst,uint32_t index)

{
  uint uVar1;
  uint32_t uVar2;
  
  if (index != 0) {
    return false;
  }
  uVar1 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar1 = (uint)inst->has_result_id_;
  }
  if ((2 < (int)((ulong)((long)(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar1
      ) && (uVar2 = Instruction::GetSingleWordOperand(inst,uVar1 + 2), (uVar2 & 1) != 0)) {
    return false;
  }
  return true;
}

Assistant:

bool ScalarReplacementPass::CheckStore(const Instruction* inst,
                                       uint32_t index) const {
  if (index != 0u) return false;
  if (inst->NumInOperands() >= 3 &&
      inst->GetSingleWordInOperand(2u) &
          uint32_t(spv::MemoryAccessMask::Volatile))
    return false;
  return true;
}